

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipeMsg.cpp
# Opt level: O1

int32_t MsgHelper::serializeAddr(S5AddrInfo *info,uint8_t *buf)

{
  char *__cp;
  int iVar1;
  size_t sVar2;
  uint uVar3;
  
  *buf = info->ATYP;
  __cp = info->ADDR;
  if (info->ATYP == '\x04') {
    iVar1 = inet_pton(10,__cp,buf + 1);
    uVar3 = 0x11;
  }
  else {
    if (info->ATYP != '\x01') {
      sVar2 = strlen(__cp);
      buf[1] = (uint8_t)sVar2;
      memcpy(buf + 2,__cp,sVar2 & 0xff);
      uVar3 = ((uint)sVar2 & 0xff) + 2;
      goto LAB_0012ad2b;
    }
    iVar1 = inet_pton(2,__cp,buf + 1);
    uVar3 = 5;
  }
  if (iVar1 == 0) {
    return 0;
  }
LAB_0012ad2b:
  writeUint16InBigEndian(buf + uVar3,info->PORT);
  return uVar3 + 2;
}

Assistant:

int32_t MsgHelper::serializeAddr(const S5AddrInfo* info, uint8_t* buf)
{
	int32_t ADDR_LEN;
	buf[0] = info->ATYP;
	if(info->ATYP == SOKS5_ATYP_IPV4)
	{
		ADDR_LEN = 4;
		if(0 == ::inet_pton(AF_INET, info->ADDR, &buf[1]))
			return 0;
	}
	else if(info->ATYP == SOKS5_ATYP_IPV6)
	{
		ADDR_LEN = 16;
		if(0 == ::inet_pton(AF_INET6, info->ADDR, &buf[1]))
			return 0;
	}
	else
	{
		buf[1] = (uint8_t)strlen(info->ADDR);
		memcpy(buf + 2, info->ADDR, buf[1]);
		ADDR_LEN = buf[1] + 1;
	}
	writeUint16InBigEndian((void*)&buf[1 + ADDR_LEN], info->PORT);
	return 1 + ADDR_LEN + 2;
}